

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int obmc_diamond_search_sad
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv,
              int search_step,int *num00)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8_t *puVar9;
  long lVar10;
  int in_ECX;
  short *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int *in_R8;
  int sad;
  FULLPEL_MV mv;
  int idx;
  search_site *site;
  int step;
  int best_site;
  int best_sad;
  uint8_t *init_ref;
  uint8_t *best_address;
  int tot_steps;
  buf_2d *ref_buf;
  int32_t *mask;
  int32_t *wsrc;
  MSBuffers *ms_buffers;
  MV_COST_PARAMS *mv_cost_params;
  search_site_config *cfg;
  aom_variance_fn_ptr_t *fn_ptr;
  MV_COST_PARAMS *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  FULLPEL_MV local_98;
  int local_94;
  int local_84;
  int local_80;
  int local_7c;
  uint8_t *local_70;
  
  lVar1 = *(long *)(in_RDI + 8);
  lVar2 = *(long *)(in_RDI + 0x50);
  uVar3 = *(undefined8 *)(in_RDI + 0x38);
  uVar4 = *(undefined8 *)(in_RDI + 0x40);
  lVar5 = *(long *)(in_RDI + 0x10);
  local_84 = *(int *)(lVar2 + 0xbb0) - in_ECX;
  clamp_fullmv((FULLPEL_MV *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (FullMvLimits *)in_stack_ffffffffffffff58);
  puVar9 = get_buf_from_fullmv((buf_2d *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               (FULLPEL_MV *)in_stack_ffffffffffffff58);
  *in_R8 = 0;
  *(undefined4 *)in_RDX = in_ESI;
  iVar6 = (**(code **)(lVar1 + 0x58))(puVar9,*(undefined4 *)(lVar5 + 0x18),uVar3,uVar4);
  local_7c = mvsad_err_cost_((FULLPEL_MV *)CONCAT44(in_stack_ffffffffffffff64,iVar6),
                             in_stack_ffffffffffffff58);
  local_7c = iVar6 + local_7c;
  local_70 = puVar9;
  while (local_84 = local_84 + -1, -1 < local_84) {
    lVar10 = lVar2 + (long)local_84 * 0x88;
    local_80 = 0;
    for (local_94 = 1; local_94 <= *(int *)(lVar2 + 0xbb4 + (long)local_84 * 4);
        local_94 = local_94 + 1) {
      local_98.col = in_RDX[1] + *(short *)(lVar10 + 2 + (long)local_94 * 8);
      local_98.row = *in_RDX + *(short *)(lVar10 + (long)local_94 * 8);
      iVar7 = av1_is_fullmv_in_range((FullMvLimits *)(in_RDI + 0x58),local_98);
      if ((iVar7 != 0) &&
         (iVar7 = (**(code **)(lVar1 + 0x58))
                            (local_70 + *(int *)(lVar10 + 4 + (long)local_94 * 8),
                             *(undefined4 *)(lVar5 + 0x18),uVar3,uVar4), iVar7 < local_7c)) {
        iVar8 = mvsad_err_cost_((FULLPEL_MV *)CONCAT44(iVar7,iVar6),in_stack_ffffffffffffff58);
        if (iVar8 + iVar7 < local_7c) {
          local_80 = local_94;
          local_7c = iVar8 + iVar7;
        }
      }
    }
    if (local_80 == 0) {
      if (local_70 == puVar9) {
        *in_R8 = *in_R8 + 1;
      }
    }
    else {
      *in_RDX = *in_RDX + *(short *)(lVar10 + (long)local_80 * 8);
      in_RDX[1] = in_RDX[1] + *(short *)(lVar10 + 2 + (long)local_80 * 8);
      local_70 = local_70 + *(int *)(lVar10 + 4 + (long)local_80 * 8);
    }
  }
  return local_7c;
}

Assistant:

static int obmc_diamond_search_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, FULLPEL_MV start_mv,
    FULLPEL_MV *best_mv, int search_step, int *num00) {
  const aom_variance_fn_ptr_t *fn_ptr = ms_params->vfp;
  const search_site_config *cfg = ms_params->search_sites;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *const ref_buf = ms_buffers->ref;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  const uint8_t *best_address, *init_ref;
  int best_sad = INT_MAX;
  int best_site = 0;

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  best_address = init_ref = get_buf_from_fullmv(ref_buf, &start_mv);
  *num00 = 0;
  *best_mv = start_mv;

  // Check the starting position
  best_sad = fn_ptr->osdf(best_address, ref_buf->stride, wsrc, mask) +
             mvsad_err_cost_(best_mv, mv_cost_params);

  for (int step = tot_steps - 1; step >= 0; --step) {
    const search_site *const site = cfg->site[step];
    best_site = 0;
    for (int idx = 1; idx <= cfg->searches_per_step[step]; ++idx) {
      const FULLPEL_MV mv = { best_mv->row + site[idx].mv.row,
                              best_mv->col + site[idx].mv.col };
      if (av1_is_fullmv_in_range(&ms_params->mv_limits, mv)) {
        int sad = fn_ptr->osdf(best_address + site[idx].offset, ref_buf->stride,
                               wsrc, mask);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = idx;
          }
        }
      }
    }

    if (best_site != 0) {
      best_mv->row += site[best_site].mv.row;
      best_mv->col += site[best_site].mv.col;
      best_address += site[best_site].offset;
    } else if (best_address == init_ref) {
      (*num00)++;
    }
  }
  return best_sad;
}